

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'\''>,_toml::detail::exactly<3UL>_>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>,_toml::detail::unlimited>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  value_type *other;
  success<toml::detail::region> local_108;
  undefined1 local_b0 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region retval;
  location *loc_local;
  
  region::region((region *)&rslt.field_1.succ.value.last_,loc);
  do {
    either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::repeat<toml::detail::character<'\''>,_toml::detail::exactly<3UL>_>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_b0,loc);
    bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_b0);
    if (bVar1) {
      ok<toml::detail::region>(&local_108,(region *)&rslt.field_1.succ.value.last_);
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_108);
      success<toml::detail::region>::~success(&local_108);
    }
    else {
      other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_b0);
      region::operator+=((region *)&rslt.field_1.succ.value.last_,other);
    }
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_b0);
  } while (!bVar1);
  region::~region((region *)&rslt.field_1.succ.value.last_);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }